

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsd.h
# Opt level: O0

void internal_finalize_bsd_addr(bsd_addr_t *addr)

{
  bsd_addr_t *addr_local;
  
  if ((addr->mem).ss_family == 10) {
    addr->ip = (addr->mem).__ss_padding + 6;
    addr->ip_length = 0x10;
  }
  else if ((addr->mem).ss_family == 2) {
    addr->ip = (addr->mem).__ss_padding + 2;
    addr->ip_length = 4;
  }
  else {
    addr->ip_length = 0;
  }
  return;
}

Assistant:

static inline void internal_finalize_bsd_addr(struct bsd_addr_t *addr) {
    // parse, so to speak, the address
    if (addr->mem.ss_family == AF_INET6) {
        addr->ip = (char *) &((struct sockaddr_in6 *) addr)->sin6_addr;
        addr->ip_length = sizeof(struct in6_addr);
    } else if (addr->mem.ss_family == AF_INET) {
        addr->ip = (char *) &((struct sockaddr_in *) addr)->sin_addr;
        addr->ip_length = sizeof(struct in_addr);
    } else {
        addr->ip_length = 0;
    }
}